

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlconfig.c
# Opt level: O2

int configure_urlbase(IXML_Document *doc,sockaddr *serverAddr,char *alias,time_t last_modified,
                     char *docURL)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  IXML_NodeList *nList;
  IXML_Node *pIVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  char *__s;
  IXML_Element *element;
  ulong __maxlen;
  char *pcVar10;
  char *pcVar11;
  long lStack_210;
  membuffer url_str;
  membuffer local_1d8;
  uri_type uri;
  char ipaddr_port [180];
  
  uVar2 = serverAddr->sa_family;
  uVar3 = (uint)uVar2;
  if (uVar2 == 2) {
    pcVar10 = "%s:%d";
    lStack_210 = 4;
LAB_00114906:
    inet_ntop(uVar3,serverAddr->sa_data + lStack_210 + -2,(char *)&uri,0x2e);
    uVar3 = snprintf(ipaddr_port,0xb4,pcVar10,&uri,
                     (ulong)(ushort)(*(ushort *)serverAddr->sa_data << 8 |
                                    *(ushort *)serverAddr->sa_data >> 8));
    if (uVar3 < 0xb4) goto LAB_00114951;
    iVar5 = -0x6a;
    pcVar10 = (char *)0x0;
LAB_00114beb:
    __s = (char *)0x0;
  }
  else {
    if (uVar2 == 10) {
      pcVar10 = "[%s]:%d";
      uVar3 = 10;
      lStack_210 = 8;
      goto LAB_00114906;
    }
LAB_00114951:
    membuffer_init(&url_str);
    membuffer_init(&local_1d8);
    nList = ixmlDocument_getElementsByTagName(doc,"URLBase");
    iVar5 = -0x6b;
    if (nList != (IXML_NodeList *)0x0) {
      pIVar6 = ixmlNodeList_item(nList,0);
      if (pIVar6 == (IXML_Node *)0x0) {
        __assert_fail("urlbase_node != NULL",".upnp/src/urlconfig/urlconfig.c",0x11e,
                      "int config_description_doc(IXML_Document *, const char *, char **)");
      }
      pIVar6 = ixmlNode_getFirstChild(pIVar6);
      if (pIVar6 != (IXML_Node *)0x0) {
        pcVar10 = ixmlNode_getNodeValue(pIVar6);
        iVar5 = -0x6c;
        if (pcVar10 != (char *)0x0) {
          sVar7 = strlen(pcVar10);
          iVar4 = parse_uri(pcVar10,sVar7,&uri);
          element = (IXML_Element *)0x0;
          if ((-1 < iVar4) && (uri.type == ABSOLUTE)) {
            iVar5 = membuffer_assign(&url_str,uri.scheme.buff,uri.scheme.size);
            if ((((iVar5 == 0) &&
                 ((iVar5 = membuffer_append_str(&url_str,"://"), iVar5 == 0 &&
                  (iVar5 = membuffer_append_str(&url_str,ipaddr_port), iVar5 == 0)))) &&
                (((uri.pathquery.size != 0 && (*uri.pathquery.buff == '/')) ||
                 ((iVar5 = membuffer_append_str(&url_str,"/"), iVar5 == 0 &&
                  (iVar5 = membuffer_append_str(&local_1d8,"/"), iVar5 == 0)))))) &&
               (((iVar5 = membuffer_append(&url_str,uri.pathquery.buff,uri.pathquery.size),
                 iVar5 == 0 &&
                 (iVar5 = membuffer_append(&local_1d8,uri.pathquery.buff,uri.pathquery.size),
                 iVar5 == 0)) &&
                (((url_str.buf[url_str.length - 1] == '/' ||
                  (iVar5 = membuffer_append(&url_str,"/",1), iVar5 == 0)) &&
                 (iVar5 = ixmlNode_setNodeValue(pIVar6,url_str.buf), iVar5 == 0)))))) {
LAB_00114bac:
              pcVar10 = membuffer_detach(&local_1d8);
              goto LAB_00114dd8;
            }
            element = (IXML_Element *)0x0;
            iVar5 = -0x68;
          }
          goto LAB_00114bc3;
        }
      }
      element = (IXML_Element *)0x0;
      goto LAB_00114bc3;
    }
    element = ixmlDocument_createElement(doc,"URLBase");
    if (element == (IXML_Element *)0x0) {
      element = (IXML_Element *)0x0;
LAB_00114bc0:
      iVar5 = -0x68;
LAB_00114bc3:
      ixmlElement_free(element);
      pcVar10 = (char *)0x0;
    }
    else {
      iVar4 = membuffer_append_str(&url_str,"http://");
      if (((iVar4 != 0) || (iVar4 = membuffer_append_str(&url_str,ipaddr_port), iVar4 != 0)) ||
         ((iVar4 = membuffer_append_str(&url_str,"/"), iVar4 != 0 ||
          (iVar4 = membuffer_append_str(&local_1d8,"/"), iVar4 != 0)))) goto LAB_00114bc0;
      pIVar6 = ixmlNode_getFirstChild(&doc->n);
      if ((pIVar6 == (IXML_Node *)0x0) ||
         (iVar4 = ixmlNode_appendChild(pIVar6,&element->n), iVar4 != 0)) goto LAB_00114bc3;
      pIVar6 = ixmlDocument_createTextNode(doc,url_str.buf);
      if (pIVar6 != (IXML_Node *)0x0) {
        iVar4 = ixmlNode_appendChild(&element->n,pIVar6);
        iVar5 = -0x38f;
        if (iVar4 == 0) goto LAB_00114bac;
        goto LAB_00114bc3;
      }
      pcVar10 = (char *)0x0;
LAB_00114dd8:
      iVar5 = 0;
    }
    ixmlNodeList_free(nList);
    membuffer_destroy(&local_1d8);
    membuffer_destroy(&url_str);
    if (iVar5 != 0) goto LAB_00114beb;
    if (pcVar10 == (char *)0x0) {
      __assert_fail("rootPath",".upnp/src/urlconfig/urlconfig.c",0x8a,
                    "int calc_alias(const char *, const char *, char **)");
    }
    if (alias == (char *)0x0) {
      __assert_fail("alias",".upnp/src/urlconfig/urlconfig.c",0x8b,
                    "int calc_alias(const char *, const char *, char **)");
    }
    sVar7 = strlen(pcVar10);
    if (sVar7 == 0) {
      pcVar11 = "/";
    }
    else {
      pcVar11 = "/";
      if (pcVar10[sVar7 - 1] == '/') {
        pcVar11 = "";
      }
    }
    cVar1 = *alias;
    sVar8 = strlen(pcVar11);
    sVar9 = strlen(alias + (cVar1 == '/'));
    sVar7 = sVar7 + sVar8 + sVar9 + 1;
    __s = (char *)calloc(1,sVar7);
    if (__s == (char *)0x0) {
      iVar5 = -0x68;
      goto LAB_00114beb;
    }
    snprintf(__s,sVar7,"%s%s%s",pcVar10,pcVar11,alias + (cVar1 == '/'));
    sVar7 = strlen(ipaddr_port);
    if (sVar7 == 0) {
      __assert_fail("ipPortStr != NULL && strlen(ipPortStr) > 0",".upnp/src/urlconfig/urlconfig.c",
                    0xc0,"int calc_descURL(const char *, const char *, char *)");
    }
    sVar8 = strlen(__s);
    if (sVar8 == 0) {
      __assert_fail("alias != NULL && strlen(alias) > 0",".upnp/src/urlconfig/urlconfig.c",0xc1,
                    "int calc_descURL(const char *, const char *, char *)");
    }
    __maxlen = sVar7 + sVar8 + 8;
    iVar5 = 0;
    if (__maxlen < 0xb5) {
      snprintf(docURL,__maxlen,"%s%s%s","http://",ipaddr_port,__s);
      UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0xc9,"desc url: %s\n",docURL);
      pcVar11 = ixmlPrintDocument(doc);
      if (pcVar11 != (char *)0x0) {
        UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0x1a0,"desc url: %s\n",docURL);
        UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0x1a1,"doc = %s\n",pcVar11);
        sVar7 = strlen(pcVar11);
        iVar5 = web_server_set_alias(__s,pcVar11,sVar7,last_modified);
        goto LAB_00114bf1;
      }
    }
    else {
      iVar5 = -0x76;
    }
  }
  pcVar11 = (char *)0x0;
LAB_00114bf1:
  free(pcVar10);
  free(__s);
  if (iVar5 != 0) {
    ixmlFreeDOMString(pcVar11);
  }
  return iVar5;
}

Assistant:

int configure_urlbase(IXML_Document *doc,
	const struct sockaddr *serverAddr,
	const char *alias,
	time_t last_modified,
	char docURL[LINE_SIZE])
{
	char *root_path = NULL;
	char *new_alias = NULL;
	char *xml_str = NULL;
	int err_code;
	char ipaddr_port[LINE_SIZE];

	/* get IP address and port */
	err_code = addrToString(serverAddr, ipaddr_port, sizeof(ipaddr_port));
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}

	/* config url-base in 'doc' */
	err_code = config_description_doc(doc, ipaddr_port, &root_path);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* calc alias */
	err_code = calc_alias(alias, root_path, &new_alias);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* calc full url for desc doc */
	err_code = calc_descURL(ipaddr_port, new_alias, docURL);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* xml doc to str */
	xml_str = ixmlPrintDocument(doc);
	if (xml_str == NULL) {
		goto error_handler;
	}

	UpnpPrintf(
		UPNP_INFO, API, __FILE__, __LINE__, "desc url: %s\n", docURL);
	UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__, "doc = %s\n", xml_str);
	/* store in web server */
	err_code = web_server_set_alias(
		new_alias, xml_str, strlen(xml_str), last_modified);

error_handler:
	free(root_path);
	free(new_alias);

	if (err_code != UPNP_E_SUCCESS) {
		ixmlFreeDOMString(xml_str);
	}
	return err_code;
}